

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LiteralIndexingStructure.hpp
# Opt level: O2

int __thiscall
Indexing::LiteralIndexingStructure<Inferences::ALASCA::BinaryResolutionConf::Rhs>::remove
          (LiteralIndexingStructure<Inferences::ALASCA::BinaryResolutionConf::Rhs> *this,
          char *__filename)

{
  int iVar1;
  SelectedLiteral local_40;
  
  Kernel::SelectedLiteral::SelectedLiteral(&local_40,(SelectedLiteral *)__filename);
  iVar1 = (*this->_vptr_LiteralIndexingStructure[2])(this,&local_40,0);
  return iVar1;
}

Assistant:

void remove(LeafData ld) { handle(std::move(ld), /* insert = */ false); }